

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint __thiscall kj::_::HashCoder::operator*(HashCoder *this,RawBrandedSchema *ptr)

{
  uint uVar1;
  RawBrandedSchema *ptr_local;
  HashCoder *this_local;
  
  uVar1 = operator*(this,(unsigned_long_long)ptr);
  return uVar1;
}

Assistant:

uint operator*(T* ptr) const {
    if (sizeof(ptr) == sizeof(uint)) {
      // TODO(cleanup): In C++17, make the if() above be `if constexpr ()`, then change this to
      //   reinterpret_cast<uint>(ptr).
      return reinterpret_cast<unsigned long long>(ptr);
    } else {
      return operator*(reinterpret_cast<unsigned long long>(ptr));
    }
  }